

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  int iVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Mat local_78;
  
  iVar7 = bottom_top_blob->c;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    iVar6 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar6 != iVar7; iVar6 = iVar6 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar6);
      pauVar5 = (undefined1 (*) [16])local_78.data;
      Mat::~Mat(&local_78);
      iVar4 = iVar9;
      while (bVar10 = iVar4 != 0, iVar4 = iVar4 + -1, bVar10) {
        auVar1 = *pauVar5;
        auVar11 = minps(auVar1,_DAT_002cec70);
        auVar11 = maxps(auVar11,_DAT_002cec80);
        fVar16 = auVar11._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar11._4_4_ * 1.442695 + 0.5;
        fVar22 = auVar11._8_4_ * 1.442695 + 0.5;
        fVar23 = auVar11._12_4_ * 1.442695 + 0.5;
        fVar24 = (float)(int)fVar16;
        fVar25 = (float)(int)fVar21;
        fVar26 = (float)(int)fVar22;
        fVar27 = (float)(int)fVar23;
        fVar24 = fVar24 - (float)(-(uint)(fVar16 < fVar24) & 0x3f800000);
        fVar25 = fVar25 - (float)(-(uint)(fVar21 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar22 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar23 < fVar27) & 0x3f800000);
        fVar16 = auVar11._0_4_ - fVar24 * 0.6931472;
        fVar21 = auVar11._4_4_ - fVar25 * 0.6931472;
        fVar22 = auVar11._8_4_ - fVar26 * 0.6931472;
        fVar23 = auVar11._12_4_ - fVar27 * 0.6931472;
        auVar17._0_4_ =
             (float)((int)fVar24 * 0x800000 + 0x3f800000) *
             (fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
        auVar17._4_4_ =
             (float)((int)fVar25 * 0x800000 + 0x3f800000) *
             (fVar21 + 1.0 +
             (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
               0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21) + 1.0;
        auVar17._8_4_ =
             (float)((int)fVar26 * 0x800000 + 0x3f800000) *
             (fVar22 + 1.0 +
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * fVar22 * fVar22) + 1.0;
        auVar17._12_4_ =
             (float)((int)fVar27 * 0x800000 + 0x3f800000) *
             (fVar23 + 1.0 +
             (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
               0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * fVar23 * fVar23) + 1.0;
        auVar11 = maxps(auVar17,_DAT_002ced10);
        fVar16 = (float)(auVar11._0_4_ & 0x807fffff | 0x3f000000);
        fVar22 = (float)(auVar11._4_4_ & 0x807fffff | 0x3f000000);
        fVar24 = (float)(auVar11._8_4_ & 0x807fffff | 0x3f000000);
        fVar26 = (float)(auVar11._12_4_ & 0x807fffff | 0x3f000000);
        fVar21 = fVar16 + -1.0 + (float)(-(uint)(fVar16 < 0.70710677) & (uint)fVar16);
        fVar23 = fVar22 + -1.0 + (float)(-(uint)(fVar22 < 0.70710677) & (uint)fVar22);
        fVar25 = fVar24 + -1.0 + (float)(-(uint)(fVar24 < 0.70710677) & (uint)fVar24);
        fVar27 = fVar26 + -1.0 + (float)(-(uint)(fVar26 < 0.70710677) & (uint)fVar26);
        auVar18._0_4_ =
             ~-(uint)(auVar17._0_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._0_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar16 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar21 +
                    (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) * fVar21 +
                          -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057) * fVar21 +
                       0.20000714) * fVar21 + -0.24999994) * fVar21 + 0.3333333) * fVar21 + -0.5) *
                    fVar21 * fVar21) * -2.0);
        auVar18._4_4_ =
             ~-(uint)(auVar17._4_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._4_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar22 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar23 +
                    (((((((((fVar23 * 0.070376836 + -0.1151461) * fVar23 + 0.116769984) * fVar23 +
                          -0.12420141) * fVar23 + 0.14249323) * fVar23 + -0.16668057) * fVar23 +
                       0.20000714) * fVar23 + -0.24999994) * fVar23 + 0.3333333) * fVar23 + -0.5) *
                    fVar23 * fVar23) * -2.0);
        auVar18._8_4_ =
             ~-(uint)(auVar17._8_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._8_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar24 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar25 +
                    (((((((((fVar25 * 0.070376836 + -0.1151461) * fVar25 + 0.116769984) * fVar25 +
                          -0.12420141) * fVar25 + 0.14249323) * fVar25 + -0.16668057) * fVar25 +
                       0.20000714) * fVar25 + -0.24999994) * fVar25 + 0.3333333) * fVar25 + -0.5) *
                    fVar25 * fVar25) * -2.0);
        auVar18._12_4_ =
             ~-(uint)(auVar17._12_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._12_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar26 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar27 +
                    (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                          -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 +
                       0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5) *
                    fVar27 * fVar27) * -2.0);
        auVar12._0_8_ =
             CONCAT44(-(uint)(auVar17._4_4_ <= 0.0),-(uint)(auVar17._0_4_ <= 0.0)) &
             0x7fffffff7fffffff;
        auVar12._8_4_ = -(uint)(auVar17._8_4_ <= 0.0) & 0x7fffffff;
        auVar12._12_4_ = -(uint)(auVar17._12_4_ <= 0.0) & 0x7fffffff;
        auVar11 = minps(auVar12 | auVar18,_DAT_002cec70);
        auVar11 = maxps(auVar11,_DAT_002cec80);
        fVar16 = auVar11._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar11._4_4_ * 1.442695 + 0.5;
        fVar22 = auVar11._8_4_ * 1.442695 + 0.5;
        fVar23 = auVar11._12_4_ * 1.442695 + 0.5;
        fVar24 = (float)(int)fVar16;
        fVar25 = (float)(int)fVar21;
        fVar26 = (float)(int)fVar22;
        fVar27 = (float)(int)fVar23;
        fVar24 = fVar24 - (float)(-(uint)(fVar16 < fVar24) & 0x3f800000);
        fVar25 = fVar25 - (float)(-(uint)(fVar21 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar22 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar23 < fVar27) & 0x3f800000);
        fVar16 = auVar11._0_4_ - fVar24 * 0.6931472;
        fVar21 = auVar11._4_4_ - fVar25 * 0.6931472;
        fVar22 = auVar11._8_4_ - fVar26 * 0.6931472;
        fVar23 = auVar11._12_4_ - fVar27 * 0.6931472;
        auVar13._0_4_ =
             fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
        auVar13._4_4_ =
             fVar21 + 1.0 +
             (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
               0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21;
        auVar13._8_4_ =
             fVar22 + 1.0 +
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * fVar22 * fVar22;
        auVar13._12_4_ =
             fVar23 + 1.0 +
             (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
               0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * fVar23 * fVar23;
        fVar24 = (float)((int)fVar24 * 0x800000 + 0x3f800000) * auVar13._0_4_ + 1.0;
        fVar25 = (float)((int)fVar25 * 0x800000 + 0x3f800000) * auVar13._4_4_ + 1.0;
        fVar26 = (float)((int)fVar26 * 0x800000 + 0x3f800000) * auVar13._8_4_ + 1.0;
        fVar27 = (float)((int)fVar27 * 0x800000 + 0x3f800000) * auVar13._12_4_ + 1.0;
        auVar2._4_4_ = fVar25;
        auVar2._0_4_ = fVar24;
        auVar2._8_4_ = fVar26;
        auVar2._12_4_ = fVar27;
        auVar11 = rcpps(auVar13,auVar2);
        fVar16 = auVar11._0_4_;
        fVar21 = auVar11._4_4_;
        fVar22 = auVar11._8_4_;
        fVar23 = auVar11._12_4_;
        *(float *)*pauVar5 =
             (fVar16 + fVar16 + -1.0 + (2.0 - fVar24 * (fVar16 + fVar16)) * fVar16) * auVar1._0_4_;
        *(float *)(*pauVar5 + 4) =
             (fVar21 + fVar21 + -1.0 + (2.0 - fVar25 * (fVar21 + fVar21)) * fVar21) * auVar1._4_4_;
        *(float *)(*pauVar5 + 8) =
             (fVar22 + fVar22 + -1.0 + (2.0 - fVar26 * (fVar22 + fVar22)) * fVar22) * auVar1._8_4_;
        *(float *)(*pauVar5 + 0xc) =
             (fVar23 + fVar23 + -1.0 + (2.0 - fVar27 * (fVar23 + fVar23)) * fVar23) * auVar1._12_4_;
        pauVar5 = pauVar5 + 1;
      }
    }
  }
  else {
    iVar6 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
      iVar6 = 0;
    }
    for (; iVar6 != iVar7; iVar6 = iVar6 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar6);
      pvVar3 = local_78.data;
      Mat::~Mat(&local_78);
      lVar8 = 0;
      pauVar5 = (undefined1 (*) [16])pvVar3;
      for (iVar4 = 0; iVar4 + 3 < iVar9; iVar4 = iVar4 + 4) {
        auVar1 = *pauVar5;
        auVar11 = minps(auVar1,_DAT_002cec70);
        auVar11 = maxps(auVar11,_DAT_002cec80);
        fVar16 = auVar11._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar11._4_4_ * 1.442695 + 0.5;
        fVar22 = auVar11._8_4_ * 1.442695 + 0.5;
        fVar23 = auVar11._12_4_ * 1.442695 + 0.5;
        fVar24 = (float)(int)fVar16;
        fVar25 = (float)(int)fVar21;
        fVar26 = (float)(int)fVar22;
        fVar27 = (float)(int)fVar23;
        fVar24 = fVar24 - (float)(-(uint)(fVar16 < fVar24) & 0x3f800000);
        fVar25 = fVar25 - (float)(-(uint)(fVar21 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar22 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar23 < fVar27) & 0x3f800000);
        fVar16 = auVar11._0_4_ - fVar24 * 0.6931472;
        fVar21 = auVar11._4_4_ - fVar25 * 0.6931472;
        fVar22 = auVar11._8_4_ - fVar26 * 0.6931472;
        fVar23 = auVar11._12_4_ - fVar27 * 0.6931472;
        auVar19._0_4_ =
             (float)((int)fVar24 * 0x800000 + 0x3f800000) *
             (fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
        auVar19._4_4_ =
             (float)((int)fVar25 * 0x800000 + 0x3f800000) *
             (fVar21 + 1.0 +
             (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
               0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21) + 1.0;
        auVar19._8_4_ =
             (float)((int)fVar26 * 0x800000 + 0x3f800000) *
             (fVar22 + 1.0 +
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * fVar22 * fVar22) + 1.0;
        auVar19._12_4_ =
             (float)((int)fVar27 * 0x800000 + 0x3f800000) *
             (fVar23 + 1.0 +
             (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
               0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * fVar23 * fVar23) + 1.0;
        auVar11 = maxps(auVar19,_DAT_002ced10);
        fVar16 = (float)(auVar11._0_4_ & 0x807fffff | 0x3f000000);
        fVar22 = (float)(auVar11._4_4_ & 0x807fffff | 0x3f000000);
        fVar24 = (float)(auVar11._8_4_ & 0x807fffff | 0x3f000000);
        fVar26 = (float)(auVar11._12_4_ & 0x807fffff | 0x3f000000);
        fVar21 = fVar16 + -1.0 + (float)(-(uint)(fVar16 < 0.70710677) & (uint)fVar16);
        fVar23 = fVar22 + -1.0 + (float)(-(uint)(fVar22 < 0.70710677) & (uint)fVar22);
        fVar25 = fVar24 + -1.0 + (float)(-(uint)(fVar24 < 0.70710677) & (uint)fVar24);
        fVar27 = fVar26 + -1.0 + (float)(-(uint)(fVar26 < 0.70710677) & (uint)fVar26);
        auVar20._0_4_ =
             ~-(uint)(auVar19._0_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._0_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar16 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar21 +
                    (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) * fVar21 +
                          -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057) * fVar21 +
                       0.20000714) * fVar21 + -0.24999994) * fVar21 + 0.3333333) * fVar21 + -0.5) *
                    fVar21 * fVar21) * -2.0);
        auVar20._4_4_ =
             ~-(uint)(auVar19._4_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._4_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar22 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar23 +
                    (((((((((fVar23 * 0.070376836 + -0.1151461) * fVar23 + 0.116769984) * fVar23 +
                          -0.12420141) * fVar23 + 0.14249323) * fVar23 + -0.16668057) * fVar23 +
                       0.20000714) * fVar23 + -0.24999994) * fVar23 + 0.3333333) * fVar23 + -0.5) *
                    fVar23 * fVar23) * -2.0);
        auVar20._8_4_ =
             ~-(uint)(auVar19._8_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._8_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar24 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar25 +
                    (((((((((fVar25 * 0.070376836 + -0.1151461) * fVar25 + 0.116769984) * fVar25 +
                          -0.12420141) * fVar25 + 0.14249323) * fVar25 + -0.16668057) * fVar25 +
                       0.20000714) * fVar25 + -0.24999994) * fVar25 + 0.3333333) * fVar25 + -0.5) *
                    fVar25 * fVar25) * -2.0);
        auVar20._12_4_ =
             ~-(uint)(auVar19._12_4_ <= 0.0) &
             (uint)((((float)(int)((auVar11._12_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar26 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar27 +
                    (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                          -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 +
                       0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5) *
                    fVar27 * fVar27) * -2.0);
        auVar14._0_8_ =
             CONCAT44(-(uint)(auVar19._4_4_ <= 0.0),-(uint)(auVar19._0_4_ <= 0.0)) &
             0x7fffffff7fffffff;
        auVar14._8_4_ = -(uint)(auVar19._8_4_ <= 0.0) & 0x7fffffff;
        auVar14._12_4_ = -(uint)(auVar19._12_4_ <= 0.0) & 0x7fffffff;
        auVar11 = minps(auVar14 | auVar20,_DAT_002cec70);
        auVar11 = maxps(auVar11,_DAT_002cec80);
        fVar16 = auVar11._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar11._4_4_ * 1.442695 + 0.5;
        fVar22 = auVar11._8_4_ * 1.442695 + 0.5;
        fVar23 = auVar11._12_4_ * 1.442695 + 0.5;
        fVar24 = (float)(int)fVar16;
        fVar25 = (float)(int)fVar21;
        fVar26 = (float)(int)fVar22;
        fVar27 = (float)(int)fVar23;
        fVar24 = fVar24 - (float)(-(uint)(fVar16 < fVar24) & 0x3f800000);
        fVar25 = fVar25 - (float)(-(uint)(fVar21 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar22 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar23 < fVar27) & 0x3f800000);
        fVar16 = auVar11._0_4_ - fVar24 * 0.6931472;
        fVar21 = auVar11._4_4_ - fVar25 * 0.6931472;
        fVar22 = auVar11._8_4_ - fVar26 * 0.6931472;
        fVar23 = auVar11._12_4_ - fVar27 * 0.6931472;
        auVar15._0_4_ =
             fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
        auVar15._4_4_ =
             fVar21 + 1.0 +
             (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
               0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21;
        auVar15._8_4_ =
             fVar22 + 1.0 +
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * fVar22 * fVar22;
        auVar15._12_4_ =
             fVar23 + 1.0 +
             (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
               0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * fVar23 * fVar23;
        fVar24 = (float)((int)fVar24 * 0x800000 + 0x3f800000) * auVar15._0_4_ + 1.0;
        fVar25 = (float)((int)fVar25 * 0x800000 + 0x3f800000) * auVar15._4_4_ + 1.0;
        fVar26 = (float)((int)fVar26 * 0x800000 + 0x3f800000) * auVar15._8_4_ + 1.0;
        fVar27 = (float)((int)fVar27 * 0x800000 + 0x3f800000) * auVar15._12_4_ + 1.0;
        auVar11._4_4_ = fVar25;
        auVar11._0_4_ = fVar24;
        auVar11._8_4_ = fVar26;
        auVar11._12_4_ = fVar27;
        auVar11 = rcpps(auVar15,auVar11);
        fVar16 = auVar11._0_4_;
        fVar21 = auVar11._4_4_;
        fVar22 = auVar11._8_4_;
        fVar23 = auVar11._12_4_;
        *(float *)*pauVar5 =
             (fVar16 + fVar16 + -1.0 + (2.0 - fVar24 * (fVar16 + fVar16)) * fVar16) * auVar1._0_4_;
        *(float *)(*pauVar5 + 4) =
             (fVar21 + fVar21 + -1.0 + (2.0 - fVar25 * (fVar21 + fVar21)) * fVar21) * auVar1._4_4_;
        *(float *)(*pauVar5 + 8) =
             (fVar22 + fVar22 + -1.0 + (2.0 - fVar26 * (fVar22 + fVar22)) * fVar22) * auVar1._8_4_;
        *(float *)(*pauVar5 + 0xc) =
             (fVar23 + fVar23 + -1.0 + (2.0 - fVar27 * (fVar23 + fVar23)) * fVar23) * auVar1._12_4_;
        pauVar5 = pauVar5 + 1;
        lVar8 = lVar8 + 4;
      }
      for (; (int)lVar8 < iVar9; lVar8 = lVar8 + 1) {
        fVar16 = *(float *)((undefined1 *)pvVar3 + lVar8 * 4);
        fVar21 = expf(fVar16);
        fVar21 = logf(fVar21 + 1.0);
        fVar21 = tanhf(fVar21);
        *(float *)((undefined1 *)pvVar3 + lVar8 * 4) = fVar21 * fVar16;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}